

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

bool __thiscall
chaiscript::parser::
ChaiScript_Parser<chaiscript::eval::Tracer<Count_Tracer>,_chaiscript::optimizer::Optimizer<chaiscript::optimizer::Partial_Fold,_chaiscript::optimizer::Unused_Return,_chaiscript::optimizer::Constant_Fold,_chaiscript::optimizer::If,_chaiscript::optimizer::Return,_chaiscript::optimizer::Dead_Code,_chaiscript::optimizer::Block,_chaiscript::optimizer::For_Loop,_chaiscript::optimizer::Assign_Decl>,_512UL>
::Operator_Matches::is_match(Operator_Matches *this,size_t t_group,string_view t_str)

{
  Static_String *pSVar1;
  Static_String *pSVar2;
  bool bVar3;
  size_t local_20;
  char *local_18;
  
  local_18 = t_str._M_str;
  local_20 = t_str._M_len;
  switch(t_group) {
  case 0:
    pSVar1 = std::operator()(this,(Static_String *)(this + 0x10),&local_20);
    bVar3 = pSVar1 == (Static_String *)(this + 0x10);
    goto LAB_00493e41;
  case 1:
    pSVar2 = (Static_String *)(this + 0x20);
    pSVar1 = std::operator()(this + 0x10,pSVar2,&local_20);
    break;
  case 2:
    pSVar2 = (Static_String *)(this + 0x30);
    pSVar1 = std::operator()(this + 0x20,pSVar2,&local_20);
    break;
  case 3:
    pSVar2 = (Static_String *)(this + 0x40);
    pSVar1 = std::operator()(this + 0x30,pSVar2,&local_20);
    break;
  case 4:
    pSVar2 = (Static_String *)(this + 0x50);
    pSVar1 = std::operator()(this + 0x40,pSVar2,&local_20);
    break;
  case 5:
    pSVar2 = (Static_String *)(this + 0x60);
    pSVar1 = std::operator()(this + 0x50,pSVar2,&local_20);
    break;
  case 6:
    pSVar2 = (Static_String *)(this + 0x80);
    pSVar1 = std::operator()(this + 0x60,pSVar2,&local_20);
    break;
  case 7:
    pSVar2 = (Static_String *)(this + 0xc0);
    pSVar1 = std::operator()(this + 0x80,pSVar2,&local_20);
    break;
  case 8:
    pSVar2 = (Static_String *)(this + 0xe0);
    pSVar1 = std::operator()(this + 0xc0,pSVar2,&local_20);
    break;
  case 9:
    pSVar2 = (Static_String *)(this + 0x100);
    pSVar1 = std::operator()(this + 0xe0,pSVar2,&local_20);
    break;
  case 10:
    pSVar2 = (Static_String *)(this + 0x130);
    pSVar1 = std::operator()(this + 0x100,pSVar2,&local_20);
    break;
  case 0xb:
    pSVar2 = (Static_String *)(this + 400);
    pSVar1 = std::operator()(this + 0x130,pSVar2,&local_20);
    break;
  default:
    return false;
  }
  bVar3 = pSVar1 == pSVar2;
LAB_00493e41:
  return !bVar3;
}

Assistant:

constexpr bool is_match(const std::size_t t_group, std::string_view t_str) const noexcept {
          auto match = [&t_str](const auto &array) {
            return std::any_of(array.begin(), array.end(), [&t_str](const auto &v) { return v == t_str; });
          };

          switch (t_group) {
            case 0:
              return match(m_0);
            case 1:
              return match(m_1);
            case 2:
              return match(m_2);
            case 3:
              return match(m_3);
            case 4:
              return match(m_4);
            case 5:
              return match(m_5);
            case 6:
              return match(m_6);
            case 7:
              return match(m_7);
            case 8:
              return match(m_8);
            case 9:
              return match(m_9);
            case 10:
              return match(m_10);
            case 11:
              return match(m_11);
            default:
              return false;
          }
        }